

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int map_set_(map_base_t *m,char *key,void *value,int vsize,char *alloc_category)

{
  map_node_t *pmVar1;
  map_node_t **ppmVar2;
  map_node_t *pmVar3;
  uint uVar4;
  map_node_t **ppmVar5;
  size_t sVar6;
  map_node_t *mem;
  char cVar7;
  uint uVar8;
  map_node_t *pmVar9;
  char *pcVar10;
  void *__dest;
  long lVar11;
  
  ppmVar5 = map_getref(m,key);
  if (ppmVar5 == (map_node_t **)0x0) {
    sVar6 = strlen(key);
    uVar4 = (uint)sVar6;
    lVar11 = (long)(int)((~uVar4 & 7) + uVar4 + 1);
    mem = (map_node_t *)golf_alloc_tracked(lVar11 + vsize + 0x18,alloc_category);
    if (mem == (map_node_t *)0x0) {
      mem = (map_node_t *)0x0;
    }
    else {
      memcpy(mem + 1,key,(long)(int)(uVar4 + 1));
      cVar7 = *key;
      if (cVar7 == '\0') {
        uVar4 = 0x1505;
      }
      else {
        pcVar10 = key + 1;
        uVar4 = 0x1505;
        do {
          uVar4 = (int)cVar7 ^ uVar4 * 0x21;
          cVar7 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar7 != '\0');
      }
      mem->hash = uVar4;
      __dest = (void *)((long)&mem[1].hash + lVar11);
      mem->value = __dest;
      memcpy(__dest,value,(long)vsize);
    }
    if (mem == (map_node_t *)0x0) {
      return -1;
    }
    uVar4 = m->nbuckets;
    lVar11 = (long)(int)uVar4;
    if (uVar4 <= m->nnodes) {
      uVar8 = uVar4 * 2;
      if (uVar4 == 0) {
        pmVar9 = (map_node_t *)0x0;
        uVar8 = 1;
      }
      else {
        ppmVar5 = m->buckets;
        pmVar9 = (map_node_t *)0x0;
        do {
          pmVar1 = ppmVar5[lVar11 + -1];
          while (pmVar3 = pmVar1, pmVar3 != (map_node_t *)0x0) {
            pmVar1 = pmVar3->next;
            pmVar3->next = pmVar9;
            pmVar9 = pmVar3;
          }
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      ppmVar5 = (map_node_t **)golf_realloc_tracked(m->buckets,(long)(int)uVar8 << 3,alloc_category)
      ;
      if (ppmVar5 != (map_node_t **)0x0) {
        m->buckets = ppmVar5;
        m->nbuckets = uVar8;
      }
      if ((m->buckets != (map_node_t **)0x0) &&
         (memset(m->buckets,0,(ulong)m->nbuckets << 3), pmVar9 != (map_node_t *)0x0)) {
        uVar4 = m->nbuckets;
        do {
          pmVar1 = pmVar9->next;
          uVar8 = pmVar9->hash & uVar4 - 1;
          ppmVar2 = m->buckets;
          pmVar9->next = ppmVar2[(int)uVar8];
          ppmVar2[(int)uVar8] = pmVar9;
          pmVar9 = pmVar1;
        } while (pmVar1 != (map_node_t *)0x0);
      }
      if (ppmVar5 == (map_node_t **)0x0) {
        golf_free_tracked(mem);
        return -1;
      }
    }
    uVar4 = m->nbuckets - 1 & mem->hash;
    ppmVar5 = m->buckets;
    mem->next = ppmVar5[(int)uVar4];
    ppmVar5[(int)uVar4] = mem;
    m->nnodes = m->nnodes + 1;
  }
  else {
    memcpy((*ppmVar5)->value,value,(long)vsize);
  }
  return 0;
}

Assistant:

int map_set_(map_base_t *m, const char *key, void *value, int vsize, const char *alloc_category) {
  int n, err;
  map_node_t **next, *node;
  /* Find & replace existing node */
  next = map_getref(m, key);
  if (next) {
    memcpy((*next)->value, value, vsize);
    return 0;
  }
  /* Add new node */
  node = map_newnode(key, value, vsize, alloc_category);
  if (node == NULL) goto fail;
  if (m->nnodes >= m->nbuckets) {
    n = (m->nbuckets > 0) ? (m->nbuckets << 1) : 1;
    err = map_resize(m, n, alloc_category);
    if (err) goto fail;
  }
  map_addnode(m, node);
  m->nnodes++;
  return 0;
  fail:
  if (node) golf_free(node);
  return -1;
}